

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * VmExtractSuper(jx9_vm *pVm,char *zName,sxu32 nByte)

{
  SyHashEntry *pSVar1;
  sxu32 nIdx;
  jx9_value *pValue;
  SyHashEntry *pEntry;
  sxu32 nByte_local;
  char *zName_local;
  jx9_vm *pVm_local;
  
  pSVar1 = SyHashGet(&pVm->hSuper,zName,nByte);
  if (pSVar1 == (SyHashEntry *)0x0) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    pVm_local = (jx9_vm *)SySetAt(&pVm->aMemObj,(sxu32)pSVar1->pUserData);
  }
  return (jx9_value *)pVm_local;
}

Assistant:

static jx9_value * VmExtractSuper(
	jx9_vm *pVm,       /* Target VM */
	const char *zName, /* Superglobal name: NOT NULL TERMINATED */
	sxu32 nByte        /* zName length */
	)
{
	SyHashEntry *pEntry;
	jx9_value *pValue;
	sxu32 nIdx;
	/* Query the superglobal table */
	pEntry = SyHashGet(&pVm->hSuper, (const void *)zName, nByte);
	if( pEntry == 0 ){
		/* No such entry */
		return 0;
	}
	/* Extract the superglobal index in the global object pool */
	nIdx = SX_PTR_TO_INT(pEntry->pUserData);
	/* Extract the variable value  */
	pValue = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
	return pValue;
}